

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

int unit_addrs_compare(void *v1,void *v2)

{
  unit_addrs *a2;
  unit_addrs *a1;
  void *v2_local;
  void *v1_local;
  undefined4 local_4;
  
  if (*v1 < *v2) {
    local_4 = -1;
  }
  else if (*v2 < *v1) {
    local_4 = 1;
  }
  else if (*(ulong *)((long)v1 + 8) < *(ulong *)((long)v2 + 8)) {
    local_4 = 1;
  }
  else if (*(ulong *)((long)v2 + 8) < *(ulong *)((long)v1 + 8)) {
    local_4 = -1;
  }
  else if (*(long *)(*(long *)((long)v1 + 0x10) + 0x38) <
           *(long *)(*(long *)((long)v2 + 0x10) + 0x38)) {
    local_4 = -1;
  }
  else if (*(long *)(*(long *)((long)v2 + 0x10) + 0x38) <
           *(long *)(*(long *)((long)v1 + 0x10) + 0x38)) {
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
unit_addrs_compare (const void *v1, const void *v2)
{
  const struct unit_addrs *a1 = (const struct unit_addrs *) v1;
  const struct unit_addrs *a2 = (const struct unit_addrs *) v2;

  if (a1->low < a2->low)
    return -1;
  if (a1->low > a2->low)
    return 1;
  if (a1->high < a2->high)
    return 1;
  if (a1->high > a2->high)
    return -1;
  if (a1->u->lineoff < a2->u->lineoff)
    return -1;
  if (a1->u->lineoff > a2->u->lineoff)
    return 1;
  return 0;
}